

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::DrawLine(Vector2f *a,Vector2f *b,Color *color,float thickness)

{
  ImVec2 this;
  ImU32 col;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 pos;
  ImDrawList *draw_list;
  float thickness_local;
  Color *color_local;
  Vector2f *b_local;
  Vector2f *a_local;
  
  pos = (ImVec2)GetWindowDrawList();
  local_38 = GetCursorScreenPos();
  this = pos;
  ImVec2::ImVec2(&local_40,a->x + local_38.x,a->y + local_38.y);
  ImVec2::ImVec2(&local_48,b->x + local_38.x,b->y + local_38.y);
  local_68 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*color);
  local_58 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_68);
  col = ColorConvertFloat4ToU32(&local_58);
  ImDrawList::AddLine((ImDrawList *)this,&local_40,&local_48,col,thickness);
  return;
}

Assistant:

void DrawLine(const sf::Vector2f& a, const sf::Vector2f& b, const sf::Color& color,
              float thickness) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImVec2 pos = ImGui::GetCursorScreenPos();
    draw_list->AddLine(ImVec2(a.x + pos.x, a.y + pos.y), ImVec2(b.x + pos.x, b.y + pos.y),
                       ColorConvertFloat4ToU32(toImColor(color)), thickness);
}